

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.cpp
# Opt level: O2

int get_thread_siblings(int cpuid)

{
  int iVar1;
  uint uVar2;
  FILE *__stream;
  uint uVar3;
  char sep;
  int id0;
  int id1;
  char path [256];
  
  sprintf(path,"/sys/devices/system/cpu/cpu%d/topology/thread_siblings",cpuid);
  sprintf(path,"/sys/devices/system/cpu/cpu%d/topology/thread_siblings_list",cpuid);
  __stream = fopen(path,"rb");
  if (__stream == (FILE *)0x0) {
    uVar3 = 0xffffffff;
  }
  else {
    iVar1 = __isoc99_fscanf(__stream,"%d",&id0);
    if (iVar1 == 1) {
      uVar3 = 1 << ((byte)id0 & 0x1f);
      iVar1 = id0;
      while (id0 = iVar1, iVar1 = __isoc99_fscanf(__stream,"%c%d",&sep,&id1), iVar1 == 2) {
        uVar2 = 1 << ((byte)id1 & 0x1f);
        if (sep != ',') {
          uVar2 = 0;
        }
        uVar3 = uVar2 | uVar3;
        iVar1 = id1;
        if (id0 < id1 && sep == '-') {
          while (id0 < id1) {
            id0 = id0 + 1;
            uVar3 = uVar3 | 1 << (id0 & 0x1fU);
          }
        }
      }
    }
    else {
      uVar3 = 0xffffffff;
    }
    fclose(__stream);
  }
  return uVar3;
}

Assistant:

static int get_thread_siblings(int cpuid)
{
    char path[256];
    sprintf(path, "/sys/devices/system/cpu/cpu%d/topology/thread_siblings", cpuid);

    FILE* fp = 0; //fopen(path, "rb");
    if (fp)
    {
        int thread_siblings = -1;
        int nscan = fscanf(fp, "%x", &thread_siblings);
        if (nscan != 1)
        {
            // ignore
        }

        fclose(fp);

        return thread_siblings;
    }

    // second try, parse from human-readable thread_siblings_list
    sprintf(path, "/sys/devices/system/cpu/cpu%d/topology/thread_siblings_list", cpuid);

    fp = fopen(path, "rb");
    if (fp)
    {
        int thread_siblings = -1;

        int id0;
        char sep;
        int id1;

        int nscan = fscanf(fp, "%d", &id0);
        if (nscan == 1)
        {
            thread_siblings = (1 << id0);

            while (fscanf(fp, "%c%d", &sep, &id1) == 2)
            {
                if (sep == ',')
                {
                    thread_siblings |= (1 << id1);
                }
                if (sep == '-' && id0 < id1)
                {
                    for (int i = id0 + 1; i <= id1; i++)
                    {
                        thread_siblings |= (1 << i);
                    }
                }

                id0 = id1;
            }
        }
        else
        {
            // ignore
        }

        fclose(fp);

        return thread_siblings;
    }

    return -1;
}